

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mklev.c
# Opt level: O3

void makerooms(level *lev,int levstyle)

{
  int iVar1;
  xchar xVar2;
  boolean bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  nhrect *pnVar7;
  byte bVar8;
  int iVar9;
  int iVar10;
  char cVar11;
  char cVar12;
  long lVar13;
  char cVar14;
  char cVar15;
  int iVar16;
  char cVar17;
  char cVar18;
  int iVar19;
  long lVar20;
  bool bVar21;
  bool bVar22;
  byte local_6c;
  xchar width;
  xchar ly;
  xchar lx;
  int local_68;
  uint local_64;
  int local_60;
  nhrect r2;
  
  uVar4 = mt_random();
  if (levstyle == 4) {
    uVar5 = mt_random();
    bVar22 = (uVar5 & 3) == 0;
    local_60 = (uint)bVar22 * 2 + 4;
    local_64 = (uint)(0x50 / (byte)(((char)uVar4 + (char)(uVar4 / 3) * -3) * '\x02' + 10U));
    bVar8 = 2 - bVar22;
    iVar6 = lev->nroom;
    local_68 = uVar4 % 3 + 3;
    iVar16 = 0;
    do {
      iVar9 = (iVar16 * 2 + 1) * local_64;
      iVar10 = (iVar16 * 2 + 2) * local_64;
      iVar19 = 0;
      do {
        smeq[iVar6] = iVar6;
        iVar1 = iVar19 + 2;
        iVar6 = lev->nroom;
        do_room_or_subroom(lev,lev->rooms + iVar6,iVar9 + iVar16 * 2,
                           (iVar19 + 1 << (bVar8 & 0x1f)) + iVar19,iVar10 + iVar16 * 2,
                           (iVar1 << (bVar8 & 0x1f)) + iVar19,'\x01','\0','\0','\x01');
        lev->rooms[(long)iVar6 + 1].hx = -1;
        iVar6 = lev->nroom + 1;
        lev->nroom = iVar6;
        iVar19 = iVar1;
      } while (local_60 != iVar1);
      bVar22 = iVar16 != local_68;
      iVar16 = iVar16 + 1;
    } while (bVar22);
  }
  else if (lev->nroom < 0x28) {
    bVar21 = 0x19999999 <
             (uVar4 * -0x33333333 >> 1 | (uint)((uVar4 * -0x33333333 & 1) != 0) << 0x1f);
    iVar6 = 5;
    bVar22 = false;
    local_60 = iVar6;
    do {
      while( true ) {
        pnVar7 = rnd_rect();
        if (pnVar7 == (nhrect *)0x0) {
          return;
        }
        if ((lev->nroom <= iVar6) || (uVar4 = mt_random(), bVar22 || (uVar4 & 1) == 0)) break;
        bVar3 = create_room(lev,-1,-1,'\x02','\x02',-1,-1,'\x04','\x01');
        iVar16 = lev->nroom;
        bVar22 = true;
        if (bVar3 != '\0') {
          vault_x = lev->rooms[iVar16].lx;
          vault_y = lev->rooms[iVar16].ly;
          lev->rooms[iVar16].hx = -1;
        }
LAB_001db02b:
        if (0x27 < iVar16) {
          return;
        }
      }
      if ((bVar21) ||
         ((0x26 < lev->nroom || (pnVar7 = rnd_rect(), iVar6 = local_60, pnVar7 == (nhrect *)0x0))))
      {
LAB_001dafec:
        bVar3 = create_room(lev,-1,-1,-1,-1,-1,-1,'\0',-1);
        if (bVar3 == '\0') {
          return;
        }
        iVar16 = lev->nroom;
        goto LAB_001db02b;
      }
      local_68 = CONCAT31(local_68._1_3_,'\0' < pnVar7->lx);
      local_64 = CONCAT31(local_64._1_3_,'\0' < pnVar7->ly);
      if (pnVar7->lx < '\x01') {
        uVar4 = 0xfffffffb;
      }
      else {
        uVar4 = (uint)('N' < pnVar7->hx) * 3 | 0xfffffff8;
      }
      if (pnVar7->ly < '\x01') {
        iVar16 = -4;
      }
      else {
        iVar16 = (uint)('\x13' < pnVar7->hy) * 2 + -6;
      }
      uVar5 = mt_random();
      bVar8 = ((byte)uVar5 & 7) + 5;
      width = bVar8;
      uVar5 = mt_random();
      local_6c = ((byte)uVar5 & 1) + 5;
      cVar12 = pnVar7->lx;
      cVar14 = '\x03';
      if ('\0' < cVar12) {
        cVar14 = cVar12;
      }
      iVar19 = (uVar4 + (int)pnVar7->hx) - ((uint)bVar8 + (int)cVar14);
      cVar14 = pnVar7->ly;
      cVar17 = cVar14;
      if (cVar14 < '\x01') {
        cVar17 = '\x02';
      }
      iVar6 = local_60;
      if ((iVar19 < -1) ||
         (iVar16 = (iVar16 + pnVar7->hy) - ((uint)local_6c + (int)cVar17), iVar16 < -1))
      goto LAB_001dafec;
      cVar15 = '\0';
      cVar17 = '\0';
      uVar4 = iVar19 + 1;
      if (uVar4 != 0) {
        uVar5 = mt_random();
        cVar17 = (char)(uVar5 % uVar4);
        cVar14 = pnVar7->ly;
      }
      uVar4 = iVar16 + 1;
      lx = (char)local_68 + '\x03' + cVar12 + cVar17;
      if (uVar4 != 0) {
        uVar5 = mt_random();
        cVar15 = (char)(uVar5 % uVar4);
      }
      ly = cVar14 + ((byte)local_64 | 2) + cVar15;
      bVar3 = check_room(lev,&lx,&width,&ly,(xchar *)&local_6c,'\0');
      iVar6 = local_60;
      if ((bVar3 == '\0') || ((char)local_6c < '\x05' || width < '\x05')) goto LAB_001dafec;
      r2.lx = lx + -1;
      r2.ly = ly + -1;
      r2.hx = width + lx + '\x01';
      r2.hy = local_6c + ly + '\x01';
      split_rects(pnVar7,&r2);
      xVar2 = width;
      iVar6 = (int)lx;
      local_60 = (int)ly;
      lVar13 = (long)width;
      lVar20 = (long)(char)local_6c;
      uVar4 = mt_random();
      if (SUB164(ZEXT416(uVar4) % SEXT816(lVar20 + lVar13),0) < (int)xVar2) {
        cVar17 = lx + width / '\x02';
        cVar12 = cVar17 + -1;
        cVar11 = local_6c + ly;
        cVar18 = cVar17 + '\x01';
        cVar14 = cVar11;
        cVar17 = cVar17 + width / '\x02';
        cVar15 = ly;
      }
      else {
        cVar12 = width + lx;
        cVar14 = ly + (char)local_6c / '\x02';
        cVar11 = cVar14 + -1;
        cVar15 = cVar14 + '\x01';
        cVar14 = cVar14 + (char)local_6c / '\x02';
        cVar18 = lx;
        cVar17 = cVar12;
      }
      local_64 = CONCAT31(local_64._1_3_,cVar17);
      local_68 = CONCAT31(local_68._1_3_,cVar14);
      bVar8 = depth(&lev->z);
      uVar4 = mt_random();
      bVar21 = false;
      if (uVar4 % (uint)(byte)(((bVar8 ^ (char)bVar8 >> 7) - ((char)bVar8 >> 7)) + 1) < 10) {
        uVar4 = mt_random();
        bVar21 = 0x3531dec < uVar4 * 0x3f2b3885;
      }
      iVar16 = lev->nroom;
      do_room_or_subroom(lev,lev->rooms + iVar16,iVar6,local_60,(int)cVar12,(int)cVar11,bVar21,'\0',
                         '\0','\x01');
      lev->rooms[(long)iVar16 + 1].hx = -1;
      iVar6 = lev->nroom;
      lev->nroom = iVar6 + 1;
      smeq[iVar6] = iVar6;
      iVar16 = lev->nroom;
      do_room_or_subroom(lev,lev->rooms + iVar16,(int)cVar18,(int)cVar15,(int)(char)(byte)local_64,
                         (int)(char)local_68,bVar21,'\0','\0','\x01');
      lev->rooms[(long)iVar16 + 1].hx = -1;
      iVar16 = lev->nroom;
      lev->nroom = iVar16 + 1;
      smeq[iVar16] = iVar16;
      join(lev,iVar6,iVar16,'\0');
      iVar6 = 6;
      bVar21 = true;
      local_60 = iVar6;
    } while (lev->nroom < 0x28);
  }
  return;
}

Assistant:

static void makerooms(struct level *lev, int levstyle)
{
	boolean tried_vault, do_splitrm, did_splitrm;

	/*
	 * It's worth noting that some level styles have particular weaknesses.
	 * For example, LEVSTYLE_RING has no shops since all rooms have 2 doors,
	 * and LEVSTYLE_GRID leaves no room for vaults or split rooms.
	 */

	if (levstyle == LEVSTYLE_GRID) {
	    int grid_width = rn1(3, 4);
	    int grid_height = rn2(4) ? 2 : 3;
	    int room_width = COLNO / ((grid_width + 1) * 2);
	    int room_height = (grid_height == 2) ? 4 : 2;
	    int x, y;

	    /* make grid rooms in column-major order */
	    for (x = 0; x < grid_width; x++) {
		for (y = 0; y < grid_height; y++) {
		    /*
		     * create_room() does not handle the regular grid pattern well;
		     * the room position parameter is not precise enough.
		     * So we'll do it the old-fashioned way.
		     */
		    smeq[lev->nroom] = lev->nroom;
		    add_room(lev,
			     (2 * x + 1) * room_width + 2 * x,
			     (2 * y + 1) * room_height + 2 * y,
			     (2 * x + 2) * room_width + 2 * x,
			     (2 * y + 2) * room_height + 2 * y,
			     TRUE, OROOM, FALSE);
		}
	    }

	    /* No room for a vault.  Don't bother trying. */
	    return;
	}

	/* make rooms until satisfied */
	tried_vault = FALSE;
	do_splitrm = !rn2(10);
	did_splitrm = FALSE;
	/* rnd_rect() will returns 0 if no more rects are available... */
	while (lev->nroom < MAXNROFROOMS && rnd_rect()) {
		/* don't double-count split room halves when limiting room count */
		if (lev->nroom - (did_splitrm ? 1 : 0) >= MAXNROFROOMS / 6 &&
		    rn2(2) && !tried_vault) {
			tried_vault = TRUE;
			if (create_vault(lev)) {
				vault_x = lev->rooms[lev->nroom].lx;
				vault_y = lev->rooms[lev->nroom].ly;
				lev->rooms[lev->nroom].hx = -1;
			}
		} else {
		    if (do_splitrm && lev->nroom + 1 < MAXNROFROOMS) {
			if (mk_split_room(lev)) {
			    do_splitrm = FALSE;
			    did_splitrm = TRUE;
			    continue;
			}
		    }
		    if (!create_room(lev, -1, -1, -1, -1, -1, -1, OROOM, -1))
			return;
		}
	}
	return;
}